

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool google::protobuf::internal::MergeFromImpl<true>
               (ZeroCopyInputStream *input,MessageLite *msg,TcParseTableBase *tc_table,
               ParseFlags parse_flags)

{
  TcParseTableBase *pTVar1;
  ParseContext *pPVar2;
  MessageFactory *p;
  MessageLite *pMVar3;
  bool bVar4;
  unsigned_short uVar5;
  int depth;
  uint32_t uVar6;
  TcParseTableBase *this;
  ulong uVar7;
  TailCallParseFunc p_Var8;
  bool local_149;
  undefined1 local_130 [8];
  ParseContext ctx;
  char *ptr;
  ParseFlags parse_flags_local;
  TcParseTableBase *tc_table_local;
  MessageLite *msg_local;
  ZeroCopyInputStream *input_local;
  TcFieldData local_90;
  TcParseTableBase *local_88;
  ParseContext *local_80;
  MessageFactory *local_78;
  MessageLite *local_70;
  MessageFactory *local_68;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_60;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_58;
  TcFieldData data;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  
  msg_local = (MessageLite *)input;
  depth = io::CodedInputStream::GetDefaultRecursionLimit();
  ParseContext::ParseContext<google::protobuf::io::ZeroCopyInputStream*&>
            ((ParseContext *)local_130,depth,true,(char **)&ctx.data_.factory,
             (ZeroCopyInputStream **)&msg_local);
  local_78 = ctx.data_.factory;
  local_80 = (ParseContext *)local_130;
  local_88 = tc_table + 1;
  local_70 = msg;
  while (bVar4 = ParseContext::Done(local_80,(char **)&local_78), pMVar3 = local_70, p = local_78,
        pPVar2 = local_80, ((bVar4 ^ 0xffU) & 1) != 0) {
    TcFieldData::TcFieldData(&local_90);
    pTVar1 = local_88;
    this = local_88 + -1;
    uVar5 = UnalignedLoad<unsigned_short>((char *)p);
    uVar7 = (ulong)(int)((uint)uVar5 & (uint)pTVar1[-1].fast_idx_mask);
    if ((uVar7 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   TcParseTableBase::fast_entry(this,uVar7 >> 3);
    local_58.data =
         (ulong)uVar5 ^
         ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data.field_0 + 8))->data;
    p_Var8 = TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data.field_0);
    local_60.data = local_58.data;
    local_78 = (MessageFactory *)(*p_Var8)(pMVar3,(char *)p,pPVar2,(TcFieldData)local_58,this,0);
    if ((local_78 == (MessageFactory *)0x0) ||
       (uVar6 = EpsCopyInputStream::LastTag(&local_80->super_EpsCopyInputStream), uVar6 != 1))
    break;
  }
  if ((local_88[-1].field_0x9 & 1) == 0) {
    local_68 = local_78;
    local_88 = local_88 + -1;
  }
  else {
    pTVar1 = local_88 + -1;
    local_88 = local_88 + -1;
    local_68 = (MessageFactory *)(*pTVar1->post_loop_handler)(local_70,(char *)local_78,local_80);
  }
  ctx.data_.factory = local_68;
  local_149 = false;
  if (local_68 != (MessageFactory *)0x0) {
    local_149 = EpsCopyInputStream::EndedAtEndOfStream((EpsCopyInputStream *)local_130);
  }
  if (local_149 == false) {
    input_local._7_1_ = false;
  }
  else {
    input_local._7_1_ =
         anon_unknown_18::CheckFieldPresence((ParseContext *)local_130,msg,parse_flags);
  }
  return input_local._7_1_;
}

Assistant:

bool MergeFromImpl(io::ZeroCopyInputStream* input, MessageLite* msg,
                   const internal::TcParseTableBase* tc_table,
                   MessageLite::ParseFlags parse_flags) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input);
  ptr = internal::TcParser::ParseLoop(msg, ptr, &ctx, tc_table);
  // ctx has no explicit limit (hence we end on end of stream)
  if (PROTOBUF_PREDICT_TRUE(ptr && ctx.EndedAtEndOfStream())) {
    return CheckFieldPresence(ctx, *msg, parse_flags);
  }
  return false;
}